

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Panel.cpp
# Opt level: O3

QVBoxLayout * __thiscall
Panel::createLayout(Panel *this,array<std::function<void_()>,_3UL> *panelSlots,
                   QMainWindow *mainWindow)

{
  map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>
  *this_00;
  function<void_()> *__x;
  Panel *pPVar1;
  code *pcVar2;
  undefined8 uVar3;
  mapped_type *pmVar4;
  QVBoxLayout *pQVar5;
  _Base_ptr p_Var6;
  QGroupBox *pQVar7;
  mapped_type *pmVar8;
  QPushButton *this_01;
  undefined4 *puVar9;
  QPushButton *this_02;
  QPushButton *this_03;
  int iVar10;
  _Rb_tree_header *p_Var11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  QByteArrayView QVar14;
  QByteArrayView QVar15;
  QByteArrayView QVar16;
  QByteArrayView QVar17;
  QByteArrayView QVar18;
  QByteArrayView QVar19;
  QByteArrayView QVar20;
  QByteArrayView QVar21;
  QString local_108;
  _Any_data local_e8;
  code *local_d8;
  undefined8 uStack_d0;
  QMainWindow *local_c8;
  QGroupBox *local_c0;
  function<void_()> *local_b8;
  Panel *local_b0;
  QObject local_a8 [8];
  QObject local_a0 [8];
  QObject local_98 [8];
  _Any_data local_90;
  code *local_80;
  undefined8 uStack_78;
  _Any_data local_70;
  code *local_60;
  undefined8 uStack_58;
  _Any_data local_50;
  code *local_40;
  undefined8 uStack_38;
  
  local_e8._M_unused._M_member_pointer = local_e8._M_unused._M_member_pointer & 0xffffffff00000000;
  local_c8 = mainWindow;
  local_b8 = panelSlots->_M_elems;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[2]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
              *)this,(BoardSize *)local_e8._M_pod_data,(char (*) [2])0x117c24);
  local_e8._0_4_ = 1;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[2]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
              *)this,(BoardSize *)local_e8._M_pod_data,(char (*) [2])0x117d16);
  local_e8._0_4_ = 2;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[2]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
              *)this,(BoardSize *)local_e8._M_pod_data,(char (*) [2])0x117c58);
  local_e8._0_4_ = 3;
  std::
  _Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
  ::_M_emplace_unique<BoardSize,char_const(&)[2]>
            ((_Rb_tree<BoardSize,std::pair<BoardSize_const,QRadioButton>,std::_Select1st<std::pair<BoardSize_const,QRadioButton>>,std::less<BoardSize>,std::allocator<std::pair<BoardSize_const,QRadioButton>>>
              *)this,(BoardSize *)local_e8._M_pod_data,(char (*) [2])0x117c72);
  local_e8._M_unused._M_member_pointer = (ulong)(uint)local_e8._4_4_ << 0x20;
  pmVar4 = std::
           map<BoardSize,_QRadioButton,_std::less<BoardSize>,_std::allocator<std::pair<const_BoardSize,_QRadioButton>_>_>
           ::operator[](&this->radioSizeMap,(key_type *)local_e8._M_pod_data);
  QAbstractButton::setChecked(SUB81(pmVar4,0));
  pQVar5 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar5);
  p_Var6 = (this->radioSizeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(this->radioSizeMap)._M_t._M_impl.super__Rb_tree_header;
  local_b0 = this;
  if ((_Rb_tree_header *)p_Var6 != p_Var11) {
    do {
      QBoxLayout::addSpacing((int)pQVar5);
      QBoxLayout::addWidget(pQVar5,&p_Var6[1]._M_parent,0,0);
      QVar12.m_data = (storage_type *)0x10;
      QVar12.m_size = (qsizetype)&local_e8;
      QString::fromUtf8(QVar12);
      local_108.d.d = (Data *)local_e8._M_unused._0_8_;
      local_108.d.ptr = (char16_t *)local_e8._8_8_;
      local_108.d.size = (qsizetype)local_d8;
      QWidget::setStyleSheet((QString *)&p_Var6[1]._M_parent);
      if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,8);
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var11);
  }
  QBoxLayout::addSpacing((int)pQVar5);
  pQVar7 = (QGroupBox *)operator_new(0x28);
  QVar13.m_data = (storage_type *)0x12;
  QVar13.m_size = (qsizetype)&local_e8;
  QString::fromUtf8(QVar13);
  local_108.d.d = (Data *)local_e8._M_unused._0_8_;
  local_108.d.ptr = (char16_t *)local_e8._8_8_;
  local_108.d.size = (qsizetype)local_d8;
  QGroupBox::QGroupBox(pQVar7,&local_108,(QWidget *)local_c8);
  pPVar1 = local_b0;
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,8);
    }
  }
  QWidget::setLayout((QLayout *)pQVar7);
  this_00 = &pPVar1->radioModeMap;
  local_e8._M_unused._M_member_pointer = local_e8._M_unused._M_member_pointer & 0xffffffff00000000;
  std::
  _Rb_tree<BoardMode,std::pair<BoardMode_const,QRadioButton>,std::_Select1st<std::pair<BoardMode_const,QRadioButton>>,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
  ::_M_emplace_unique<BoardMode,char_const(&)[8]>
            ((_Rb_tree<BoardMode,std::pair<BoardMode_const,QRadioButton>,std::_Select1st<std::pair<BoardMode_const,QRadioButton>>,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
              *)this_00,(BoardMode *)local_e8._M_pod_data,(char (*) [8])"Numeric");
  local_e8._0_4_ = 1;
  std::
  _Rb_tree<BoardMode,std::pair<BoardMode_const,QRadioButton>,std::_Select1st<std::pair<BoardMode_const,QRadioButton>>,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
  ::_M_emplace_unique<BoardMode,char_const(&)[8]>
            ((_Rb_tree<BoardMode,std::pair<BoardMode_const,QRadioButton>,std::_Select1st<std::pair<BoardMode_const,QRadioButton>>,std::less<BoardMode>,std::allocator<std::pair<BoardMode_const,QRadioButton>>>
              *)this_00,(BoardMode *)local_e8._M_pod_data,(char (*) [8])0x117479);
  local_e8._M_unused._M_member_pointer = (ulong)(uint)local_e8._4_4_ << 0x20;
  pmVar8 = std::
           map<BoardMode,_QRadioButton,_std::less<BoardMode>,_std::allocator<std::pair<const_BoardMode,_QRadioButton>_>_>
           ::operator[](this_00,(key_type *)local_e8._M_pod_data);
  QAbstractButton::setChecked(SUB81(pmVar8,0));
  pQVar5 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar5);
  p_Var6 = (pPVar1->radioModeMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var11 = &(pPVar1->radioModeMap)._M_t._M_impl.super__Rb_tree_header;
  local_c0 = pQVar7;
  if ((_Rb_tree_header *)p_Var6 != p_Var11) {
    do {
      QBoxLayout::addSpacing((int)pQVar5);
      QBoxLayout::addWidget(pQVar5,&p_Var6[1]._M_parent,0,0);
      QVar14.m_data = (storage_type *)0x10;
      QVar14.m_size = (qsizetype)&local_e8;
      QString::fromUtf8(QVar14);
      local_108.d.d = (Data *)local_e8._M_unused._0_8_;
      local_108.d.ptr = (char16_t *)local_e8._8_8_;
      local_108.d.size = (qsizetype)local_d8;
      QWidget::setStyleSheet((QString *)&p_Var6[1]._M_parent);
      if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,8);
        }
      }
      p_Var6 = (_Base_ptr)std::_Rb_tree_increment(p_Var6);
    } while ((_Rb_tree_header *)p_Var6 != p_Var11);
  }
  QBoxLayout::addSpacing((int)pQVar5);
  pQVar7 = (QGroupBox *)operator_new(0x28);
  QVar15.m_data = (storage_type *)0xd;
  QVar15.m_size = (qsizetype)&local_e8;
  QString::fromUtf8(QVar15);
  local_108.d.d = (Data *)local_e8._M_unused._0_8_;
  local_108.d.ptr = (char16_t *)local_e8._8_8_;
  local_108.d.size = (qsizetype)local_d8;
  QGroupBox::QGroupBox(pQVar7,&local_108,(QWidget *)local_c8);
  __x = local_b8;
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,8);
    }
  }
  QWidget::setLayout((QLayout *)pQVar7);
  this_01 = (QPushButton *)operator_new(0x28);
  QVar16.m_data = (storage_type *)0xe;
  QVar16.m_size = (qsizetype)&local_e8;
  QString::fromUtf8(QVar16);
  local_108.d.d = (Data *)local_e8._M_unused._0_8_;
  local_108.d.ptr = (char16_t *)local_e8._8_8_;
  local_108.d.size = (qsizetype)local_d8;
  QPushButton::QPushButton(this_01,&local_108,(QWidget *)local_c8);
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,8);
    }
  }
  QVar17.m_data = (storage_type *)0xb;
  QVar17.m_size = (qsizetype)&local_e8;
  QString::fromUtf8(QVar17);
  local_108.d.d = (Data *)local_e8._M_unused._0_8_;
  local_108.d.ptr = (char16_t *)local_e8._8_8_;
  local_108.d.size = (qsizetype)local_d8;
  QWidget::setStyleSheet((QString *)this_01);
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,8);
    }
  }
  std::function<void_()>::function((function<void_()> *)&local_50,__x);
  uVar3 = uStack_38;
  pcVar2 = local_40;
  local_e8._M_unused._M_object = (QArrayData *)0x0;
  local_e8._8_8_ = (char16_t *)0x0;
  local_d8 = (code *)0x0;
  uStack_d0 = uStack_38;
  if (local_40 != (code *)0x0) {
    local_e8._M_unused._M_object = local_50._M_unused._M_object;
    local_e8._8_8_ = local_50._8_8_;
    local_d8 = local_40;
    local_40 = (code *)0x0;
    uStack_38 = 0;
  }
  local_108.d.d = (Data *)QAbstractButton::clicked;
  local_108.d.ptr = (char16_t *)0x0;
  puVar9 = (undefined4 *)operator_new(0x30);
  if (pcVar2 == (code *)0x0) {
    *(undefined8 *)(puVar9 + 4) = 0;
    *(undefined8 *)(puVar9 + 6) = 0;
    *(undefined8 *)(puVar9 + 8) = 0;
  }
  else {
    local_d8 = (code *)0x0;
    uStack_d0 = 0;
    *(void **)(puVar9 + 4) = local_e8._M_unused._M_object;
    *(undefined8 *)(puVar9 + 6) = local_e8._8_8_;
    *(code **)(puVar9 + 8) = pcVar2;
  }
  *puVar9 = 1;
  *(code **)(puVar9 + 2) =
       QtPrivate::QFunctorSlotObject<std::function<void_()>,_0,_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar9 + 10) = uVar3;
  QObject::connectImpl
            (local_98,(void **)this_01,(QObject *)&local_108,(void **)this_01,(QSlotObjectBase *)0x0
             ,(ConnectionType)puVar9,(int *)0x1,(QMetaObject *)0x0);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  QMetaObject::Connection::~Connection((Connection *)local_98);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  this_02 = (QPushButton *)operator_new(0x28);
  QVar18.m_data = (storage_type *)0xb;
  QVar18.m_size = (qsizetype)&local_e8;
  QString::fromUtf8(QVar18);
  local_108.d.d = (Data *)local_e8._M_unused._0_8_;
  local_108.d.ptr = (char16_t *)local_e8._8_8_;
  local_108.d.size = (qsizetype)local_d8;
  QPushButton::QPushButton(this_02,&local_108,(QWidget *)local_c8);
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,8);
    }
  }
  QVar19.m_data = (storage_type *)0xb;
  QVar19.m_size = (qsizetype)&local_e8;
  QString::fromUtf8(QVar19);
  local_108.d.d = (Data *)local_e8._M_unused._0_8_;
  local_108.d.ptr = (char16_t *)local_e8._8_8_;
  local_108.d.size = (qsizetype)local_d8;
  QWidget::setStyleSheet((QString *)this_02);
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,8);
    }
  }
  std::function<void_()>::function((function<void_()> *)&local_70,__x + 1);
  uVar3 = uStack_58;
  pcVar2 = local_60;
  local_e8._M_unused._M_object = (QArrayData *)0x0;
  local_e8._8_8_ = (char16_t *)0x0;
  local_d8 = (code *)0x0;
  uStack_d0 = uStack_58;
  if (local_60 != (code *)0x0) {
    local_e8._M_unused._M_object = local_70._M_unused._M_object;
    local_e8._8_8_ = local_70._8_8_;
    local_d8 = local_60;
    local_60 = (code *)0x0;
    uStack_58 = 0;
  }
  local_108.d.d = (Data *)QAbstractButton::clicked;
  local_108.d.ptr = (char16_t *)0x0;
  puVar9 = (undefined4 *)operator_new(0x30);
  if (pcVar2 == (code *)0x0) {
    *(undefined8 *)(puVar9 + 4) = 0;
    *(undefined8 *)(puVar9 + 6) = 0;
    *(undefined8 *)(puVar9 + 8) = 0;
  }
  else {
    local_d8 = (code *)0x0;
    uStack_d0 = 0;
    *(void **)(puVar9 + 4) = local_e8._M_unused._M_object;
    *(undefined8 *)(puVar9 + 6) = local_e8._8_8_;
    *(code **)(puVar9 + 8) = pcVar2;
  }
  *puVar9 = 1;
  *(code **)(puVar9 + 2) =
       QtPrivate::QFunctorSlotObject<std::function<void_()>,_0,_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar9 + 10) = uVar3;
  QObject::connectImpl
            (local_a0,(void **)this_02,(QObject *)&local_108,(void **)this_02,(QSlotObjectBase *)0x0
             ,(ConnectionType)puVar9,(int *)0x1,(QMetaObject *)0x0);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  this_03 = (QPushButton *)operator_new(0x28);
  QVar20.m_data = (storage_type *)0x9;
  QVar20.m_size = (qsizetype)&local_e8;
  QString::fromUtf8(QVar20);
  local_108.d.d = (Data *)local_e8._M_unused._0_8_;
  local_108.d.ptr = (char16_t *)local_e8._8_8_;
  local_108.d.size = (qsizetype)local_d8;
  QPushButton::QPushButton(this_03,&local_108,(QWidget *)local_c8);
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,8);
    }
  }
  QVar21.m_data = (storage_type *)0xb;
  QVar21.m_size = (qsizetype)&local_e8;
  QString::fromUtf8(QVar21);
  local_108.d.d = (Data *)local_e8._M_unused._0_8_;
  local_108.d.ptr = (char16_t *)local_e8._8_8_;
  local_108.d.size = (qsizetype)local_d8;
  QWidget::setStyleSheet((QString *)this_03);
  if (&(local_108.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_108.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_108.d.d)->super_QArrayData,2,8);
    }
  }
  std::function<void_()>::function((function<void_()> *)&local_90,__x + 2);
  uVar3 = uStack_78;
  pcVar2 = local_80;
  local_e8._M_unused._M_object = (void *)0x0;
  local_e8._8_8_ = 0;
  local_d8 = (code *)0x0;
  uStack_d0 = uStack_78;
  if (local_80 != (code *)0x0) {
    local_e8._M_unused._M_object = local_90._M_unused._M_object;
    local_e8._8_8_ = local_90._8_8_;
    local_d8 = local_80;
    local_80 = (code *)0x0;
    uStack_78 = 0;
  }
  local_108.d.d = (Data *)QAbstractButton::clicked;
  local_108.d.ptr = (char16_t *)0x0;
  puVar9 = (undefined4 *)operator_new(0x30);
  if (pcVar2 == (code *)0x0) {
    *(undefined8 *)(puVar9 + 4) = 0;
    *(undefined8 *)(puVar9 + 6) = 0;
    *(undefined8 *)(puVar9 + 8) = 0;
  }
  else {
    local_d8 = (code *)0x0;
    uStack_d0 = 0;
    *(void **)(puVar9 + 4) = local_e8._M_unused._M_object;
    *(undefined8 *)(puVar9 + 6) = local_e8._8_8_;
    *(code **)(puVar9 + 8) = pcVar2;
  }
  *puVar9 = 1;
  *(code **)(puVar9 + 2) =
       QtPrivate::QFunctorSlotObject<std::function<void_()>,_0,_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar9 + 10) = uVar3;
  QObject::connectImpl
            (local_a8,(void **)this_03,(QObject *)&local_108,(void **)this_03,(QSlotObjectBase *)0x0
             ,(ConnectionType)puVar9,(int *)0x1,(QMetaObject *)0x0);
  if (local_d8 != (code *)0x0) {
    (*local_d8)(&local_e8,&local_e8,__destroy_functor);
  }
  QMetaObject::Connection::~Connection((Connection *)local_a8);
  if (local_80 != (code *)0x0) {
    (*local_80)(&local_90,&local_90,__destroy_functor);
  }
  pQVar5 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(pQVar5);
  iVar10 = (int)pQVar5;
  QLayout::setContentsMargins(iVar10,0x1e,0,0x14);
  QBoxLayout::addWidget(pQVar5,this_01,0,0);
  QBoxLayout::addSpacing(iVar10);
  QBoxLayout::addWidget(pQVar5,this_02,0,0);
  QBoxLayout::addSpacing(iVar10);
  QBoxLayout::addWidget(pQVar5,this_03,0,0);
  QBoxLayout::addSpacing(iVar10);
  QBoxLayout::addWidget(pQVar5,local_c0,0,0);
  QBoxLayout::addStretch(iVar10);
  QBoxLayout::addWidget(pQVar5,pQVar7,0,0);
  QBoxLayout::addStretch(iVar10);
  return pQVar5;
}

Assistant:

QVBoxLayout* Panel::createLayout( std::array<std::function<void()>, 3>& panelSlots, QMainWindow* mainWindow )
{
    radioSizeMap.emplace( BoardSize::FOUR, "4" );
    radioSizeMap.emplace( BoardSize::FIVE, "5" );
    radioSizeMap.emplace( BoardSize::SIX, "6" );
    radioSizeMap.emplace( BoardSize::SEVEN, "7" );
    radioSizeMap[BoardSize::FOUR].setChecked( true );

    QVBoxLayout* radioSizeLayout = new QVBoxLayout();
    for( auto& radio : radioSizeMap | std::views::values )
    {
        radioSizeLayout->addSpacing( 10 );
        radioSizeLayout->addWidget( &radio );
        radio.setStyleSheet( STYLE_MARGIN_LEFT );
    }
    radioSizeLayout->addSpacing( 30 );

    QGroupBox* radioSizeBox = new QGroupBox( "Dimension of Board", mainWindow );
    radioSizeBox->setLayout( radioSizeLayout );

    radioModeMap.emplace( BoardMode::NUMERIC, "Numeric" );
    radioModeMap.emplace( BoardMode::GRAPHIC, "Graphic" );
    radioModeMap[BoardMode::NUMERIC].setChecked( true );

    QVBoxLayout* radioModeLayout = new QVBoxLayout();
    for( auto& radio : radioModeMap | std::views::values )
    {
        radioModeLayout->addSpacing( 10 );
        radioModeLayout->addWidget( &radio );
        radio.setStyleSheet( STYLE_MARGIN_LEFT );
    }
    radioModeLayout->addSpacing( 30 );

    QGroupBox* radioModeBox = new QGroupBox( "Kind of Board", mainWindow );
    radioModeBox->setLayout( radioModeLayout );

    QPushButton* pushRandom = new QPushButton( "Generate Board", mainWindow );
    pushRandom->setStyleSheet( STYLE_HEIGHT );
    QObject::connect( pushRandom, &QPushButton::clicked, panelSlots[0] );

    QPushButton* pushSolve = new QPushButton( "Solve Board", mainWindow );
    pushSolve->setStyleSheet( STYLE_HEIGHT );
    QObject::connect( pushSolve, &QPushButton::clicked, panelSlots[1] );

    QPushButton* pushUndo = new QPushButton( "Undo Move", mainWindow );
    pushUndo->setStyleSheet( STYLE_HEIGHT );
    QObject::connect( pushUndo, &QPushButton::clicked, panelSlots[2] );

    QVBoxLayout* panelLayout = new QVBoxLayout();
    panelLayout->setContentsMargins( 30, 0, 20, 0 );
    panelLayout->addWidget( pushRandom );
    panelLayout->addSpacing( 15 );
    panelLayout->addWidget( pushSolve );
    panelLayout->addSpacing( 15 );
    panelLayout->addWidget( pushUndo );
    panelLayout->addSpacing( 30 );
    panelLayout->addWidget( radioSizeBox );
    panelLayout->addStretch();
    panelLayout->addWidget( radioModeBox );
    panelLayout->addStretch();
    return panelLayout;
}